

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O2

void rw::ps2::swizzleRaster(Raster *raster)

{
  uint8 *puVar1;
  uint uVar2;
  uint uVar3;
  uint32 uVar4;
  byte bVar5;
  uint32 logw;
  uint uVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint32 uVar12;
  ulong uVar13;
  uint uVar14;
  int minh;
  int minw;
  uint8 tmpbuf [4096];
  
  uVar10 = raster->format;
  if ((uVar10 & 0x6000) != 0) {
    bVar7 = *(byte *)((long)&raster->pixels + (long)nativeRasterOffset + 4);
    transferMinSize(((uVar10 >> 0xe & 1) != 0) + 0x13,(int)(char)bVar7,&minw,&minh);
    uVar3 = raster->width;
    puVar1 = raster->pixels;
    iVar9 = -1;
    for (iVar8 = 1; iVar8 < (int)uVar3; iVar8 = iVar8 * 2) {
      iVar9 = iVar9 + 1;
    }
    uVar2 = minw;
    if (minw < (int)uVar3) {
      uVar2 = uVar3;
    }
    iVar8 = minh;
    if (minh < raster->height) {
      iVar8 = raster->height;
    }
    logw = iVar9 + 1;
    bVar5 = (byte)logw;
    uVar3 = (4 << (bVar5 & 0x1f)) - 1;
    if (((uVar10 >> 0xe & 1) == 0) || ((bVar7 & 4) == 0)) {
      if (((uVar10 >> 0xd & 1) != 0) && ((bVar7 & 2) != 0)) {
        uVar11 = 0;
        uVar13 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar13 = uVar11;
        }
        while (uVar10 = (uint)uVar11, (int)uVar10 < iVar8) {
          for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
            for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
              uVar12 = swizzle((uint32)uVar11,uVar6 | uVar10,logw);
              tmpbuf[uVar12 & uVar3] = puVar1[(uint32)uVar11 + ((uVar6 | uVar10) << (bVar5 & 0x1f))]
              ;
            }
          }
          memcpy(puVar1 + (int)(uVar10 << (bVar5 & 0x1f)),tmpbuf,(long)(int)(uVar2 * 4));
          uVar11 = (ulong)(uVar10 + 4);
        }
      }
    }
    else {
      uVar11 = 0;
      uVar13 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar13 = uVar11;
      }
      while (uVar10 = (uint)uVar11, (int)uVar10 < iVar8) {
        for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
          for (uVar12 = 0; (uint32)uVar13 != uVar12; uVar12 = uVar12 + 1) {
            uVar14 = ((uVar6 | uVar10) << (bVar5 & 0x1f)) + uVar12;
            uVar4 = swizzle(uVar12,uVar6 | uVar10,logw);
            bVar7 = puVar1[uVar14 >> 1] >> 4;
            if ((uVar14 & 1) == 0) {
              bVar7 = puVar1[uVar14 >> 1] & 0xf;
            }
            uVar14 = (uVar4 & uVar3) >> 1;
            if ((uVar4 & 1) == 0) {
              bVar7 = tmpbuf[uVar14] & 0xf0 | bVar7;
            }
            else {
              bVar7 = bVar7 << 4 | tmpbuf[uVar14] & 0xf;
            }
            tmpbuf[uVar14] = bVar7;
          }
        }
        memcpy(puVar1 + (int)(uVar10 << ((byte)iVar9 & 0x1f)),tmpbuf,(long)(int)(uVar2 * 2));
        uVar11 = (ulong)(uVar10 + 4);
      }
    }
  }
  return;
}

Assistant:

void
swizzleRaster(Raster *raster)
{
	uint8 tmpbuf[1024*4];	// 1024x4px, maximum possible width
	uint32 mask;
	int32 x, y, w, h;
	int32 i;
	int32 logw;
	Ps2Raster *natras = GETPS2RASTEREXT(raster);
	uint8 *px;

	if((raster->format & (Raster::PAL4|Raster::PAL8)) == 0)
		return;

	int minw, minh;
	transferMinSize(raster->format & Raster::PAL4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
	w = max(raster->width, minw);
	h = max(raster->height, minh);
	px = raster->pixels;
	logw = 0;
	for(i = 1; i < raster->width; i *= 2) logw++;
	mask = (1<<(logw+2))-1;

	if(raster->format & Raster::PAL4 && natras->flags & Ps2Raster::SWIZZLED4){
		for(y = 0; y < h; y += 4){
			for(i = 0; i < 4; i++)
				for(x = 0; x < w; x++){
					uint32 a = ((y+i)<<logw)+x;
					uint32 s = swizzle(x, y+i, logw)&mask;
					uint8 c = a & 1 ? px[a>>1] >> 4 : px[a>>1] & 0xF;
					tmpbuf[s>>1] = s & 1 ? (tmpbuf[s>>1]&0xF) | c<<4 : (tmpbuf[s>>1]&0xF0) | c;
				}
			memcpy(&px[y<<(logw-1)], tmpbuf, 2*w);
		}
	}else if(raster->format & Raster::PAL8 && natras->flags & Ps2Raster::SWIZZLED8){
		for(y = 0; y < h; y += 4){
			for(i = 0; i < 4; i++)
				for(x = 0; x < w; x++){
					uint32 a = ((y+i)<<logw)+x;
					uint32 s = swizzle(x, y+i, logw)&mask;
					tmpbuf[s] = px[a];
				}
			memcpy(&px[y<<logw], tmpbuf, 4*w);
		}
	}
}